

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O1

void __thiscall caffe::ReductionParameter::Clear(ReductionParameter *this)

{
  if (((this->_has_bits_).has_bits_[0] & 7) != 0) {
    this->axis_ = 0;
    this->operation_ = 1;
    this->coeff_ = 1.0;
  }
  (this->_has_bits_).has_bits_[0] = 0;
  if (((ulong)(this->_internal_metadata_).
              super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
              .ptr_ & 1) == 0) {
    return;
  }
  google::protobuf::internal::InternalMetadataWithArena::DoClear(&this->_internal_metadata_);
  return;
}

Assistant:

void ReductionParameter::Clear() {
// @@protoc_insertion_point(message_clear_start:caffe.ReductionParameter)
  if (_has_bits_[0 / 32] & 7u) {
    axis_ = 0;
    operation_ = 1;
    coeff_ = 1;
  }
  _has_bits_.Clear();
  _internal_metadata_.Clear();
}